

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

void glfwInitHint(int hint,int value)

{
  GLFWbool GVar1;
  int iVar2;
  GLFWbool GVar3;
  GLFWbool GVar4;
  anon_struct_4_1_6d51ede9_for_x11 aVar5;
  int value_local;
  int hint_local;
  
  GVar1 = value;
  iVar2 = _glfwInitHints.angleType;
  GVar3 = _glfwInitHints.ns.menubar;
  GVar4 = _glfwInitHints.ns.chdir;
  aVar5.xcbVulkanSurface = _glfwInitHints.x11.xcbVulkanSurface;
  if ((((hint != 0x50001) && (GVar1 = _glfwInitHints.hatButtons, iVar2 = value, hint != 0x50002)) &&
      (iVar2 = _glfwInitHints.angleType, GVar4 = value, hint != 0x51001)) &&
     ((GVar3 = value, GVar4 = _glfwInitHints.ns.chdir, hint != 0x51002 &&
      (GVar3 = _glfwInitHints.ns.menubar, aVar5.xcbVulkanSurface = value, hint != 0x52001)))) {
    _glfwInputError(0x10003,"Invalid init hint 0x%08X",(ulong)(uint)hint);
    GVar1 = _glfwInitHints.hatButtons;
    iVar2 = _glfwInitHints.angleType;
    GVar3 = _glfwInitHints.ns.menubar;
    GVar4 = _glfwInitHints.ns.chdir;
    aVar5 = _glfwInitHints.x11;
  }
  _glfwInitHints.x11.xcbVulkanSurface = aVar5.xcbVulkanSurface;
  _glfwInitHints.ns.chdir = GVar4;
  _glfwInitHints.ns.menubar = GVar3;
  _glfwInitHints.angleType = iVar2;
  _glfwInitHints.hatButtons = GVar1;
  return;
}

Assistant:

GLFWAPI void glfwInitHint(int hint, int value)
{
    switch (hint)
    {
        case GLFW_JOYSTICK_HAT_BUTTONS:
            _glfwInitHints.hatButtons = value;
            return;
        case GLFW_ANGLE_PLATFORM_TYPE:
            _glfwInitHints.angleType = value;
            return;
        case GLFW_COCOA_CHDIR_RESOURCES:
            _glfwInitHints.ns.chdir = value;
            return;
        case GLFW_COCOA_MENUBAR:
            _glfwInitHints.ns.menubar = value;
            return;
        case GLFW_X11_XCB_VULKAN_SURFACE:
            _glfwInitHints.x11.xcbVulkanSurface = value;
            return;
    }

    _glfwInputError(GLFW_INVALID_ENUM,
                    "Invalid init hint 0x%08X", hint);
}